

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

void __thiscall
capnp::SchemaFile::DiskSchemaFile::reportError
          (DiskSchemaFile *this,SourcePos start,SourcePos end,StringPtr message)

{
  ExceptionCallback *pEVar1;
  StringPtr value;
  String local_210;
  String local_1f8;
  Exception local_1e0;
  DiskSchemaFile *local_50;
  DiskSchemaFile *this_local;
  uint local_40;
  DiskSchemaFile *local_38;
  SourcePos end_local;
  uint uStack_14;
  SourcePos start_local;
  
  register0x00000030 = start._0_8_;
  local_40 = end.column;
  this_local = end._0_8_;
  local_50 = this;
  local_38 = this_local;
  end_local.byte = local_40;
  pEVar1 = kj::getExceptionCallback();
  kj::Path::toString(&local_1f8,&this->path,false);
  uStack_14 = start.line;
  value.content.size_._0_4_ = uStack_14;
  value.content.ptr = (char *)message.content.size_;
  value.content.size_._4_4_ = 0;
  kj::heapString(&local_210,(kj *)message.content.ptr,value);
  kj::Exception::Exception(&local_1e0,FAILED,&local_1f8,uStack_14,&local_210);
  (*pEVar1->_vptr_ExceptionCallback[2])(pEVar1,&local_1e0);
  kj::Exception::~Exception(&local_1e0);
  kj::String::~String(&local_210);
  kj::String::~String(&local_1f8);
  return;
}

Assistant:

void reportError(SourcePos start, SourcePos end, kj::StringPtr message) const override {
    kj::getExceptionCallback().onRecoverableException(kj::Exception(
        kj::Exception::Type::FAILED, path.toString(), start.line,
        kj::heapString(message)));
  }